

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscenebsptreeindex.cpp
# Opt level: O0

void __thiscall
QGraphicsSceneBspTreeIndexPrivate::purgeRemovedItems(QGraphicsSceneBspTreeIndexPrivate *this)

{
  bool bVar1;
  QList<QGraphicsItem_*> *this_00;
  qsizetype qVar2;
  const_reference ppQVar3;
  long in_RDI;
  QSet<QGraphicsItem_*> *unaff_retaddr;
  QGraphicsSceneBspTree *in_stack_00000008;
  int i;
  undefined4 in_stack_ffffffffffffffd8;
  parameter_type in_stack_ffffffffffffffdc;
  QList<int> *in_stack_ffffffffffffffe0;
  int local_c;
  
  if (((*(byte *)(in_RDI + 0x168) & 1) != 0) ||
     (bVar1 = QSet<QGraphicsItem_*>::isEmpty((QSet<QGraphicsItem_*> *)0xa1e051), !bVar1)) {
    QGraphicsSceneBspTree::removeItems(in_stack_00000008,unaff_retaddr);
    QSet<QGraphicsItem_*>::clear((QSet<QGraphicsItem_*> *)0xa1e088);
    QList<int>::clear(in_stack_ffffffffffffffe0);
    local_c = 0;
    while( true ) {
      this_00 = (QList<QGraphicsItem_*> *)(long)local_c;
      qVar2 = QList<QGraphicsItem_*>::size((QList<QGraphicsItem_*> *)(in_RDI + 0x108));
      if (qVar2 <= (long)this_00) break;
      ppQVar3 = QList<QGraphicsItem_*>::at
                          (this_00,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      if (*ppQVar3 == (QGraphicsItem *)0x0) {
        QList<int>::operator<<((QList<int> *)this_00,in_stack_ffffffffffffffdc);
      }
      local_c = local_c + 1;
    }
    *(undefined1 *)(in_RDI + 0x168) = 0;
  }
  return;
}

Assistant:

void QGraphicsSceneBspTreeIndexPrivate::purgeRemovedItems()
{
    if (!purgePending && removedItems.isEmpty())
        return;

    // Remove stale items from the BSP tree.
    bsp.removeItems(removedItems);
    // Purge this list.
    removedItems.clear();
    freeItemIndexes.clear();
    for (int i = 0; i < indexedItems.size(); ++i) {
        if (!indexedItems.at(i))
            freeItemIndexes << i;
    }
    purgePending = false;
}